

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::animationFinished(QMainWindowLayout *this,QWidget *widget)

{
  QList<QDockAreaLayoutItem> *__last;
  QPointer *this_00;
  Span *pSVar1;
  QLayoutItem *pQVar2;
  QDockAreaLayoutItem *this_01;
  long lVar3;
  bool bVar4;
  QWidget *pQVar5;
  QLayout *pQVar6;
  QToolBarLayout *this_02;
  QDockWidgetGroupWindow *this_03;
  QDockAreaLayoutInfo *pQVar7;
  QLayout *pQVar8;
  QDockAreaLayoutInfo *this_04;
  pointer pQVar9;
  iterator iVar10;
  quintptr id;
  QWidget *parent;
  QToolBar *pQVar11;
  QDockWidget *pQVar12;
  ulong uVar13;
  QLayoutItem *this_05;
  long lVar14;
  _Iter in_R8;
  long in_FS_OFFSET;
  insert_iterator<QList<QDockAreaLayoutItem>_> __result;
  QArrayDataPointer<int> local_c8;
  QSize local_a8;
  Data *local_a0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&widget->super_QObject)->super_QWidget
  ;
  if (pQVar5 != (QWidget *)0x0) {
    pQVar6 = QWidget::layout(pQVar5);
    this_02 = QtPrivate::qobject_cast_helper<QToolBarLayout*,QObject>(&pQVar6->super_QObject);
    if ((this_02->super_QLayout).super_QLayoutItem.field_0xd == '\x01') {
      (this_02->super_QLayout).super_QLayoutItem.field_0xd = 0;
      if ((this_02->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
        local_a8 = QWidget::size(pQVar5);
        QToolBarLayout::layoutActions(this_02,&stack0xffffffffffffff58);
      }
      QWidget::update(pQVar5);
    }
  }
  if (*(QWidget **)(this + 0x7d8) == widget) {
    this_03 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                        (&widget->super_QObject);
    if (this_03 != (QDockWidgetGroupWindow *)0x0) {
      QMainWindowLayoutState::clear((QMainWindowLayoutState *)(this + 0x3c0));
      pQVar6 = QWidget::layout(&this_03->super_QWidget);
      pQVar7 = QDockWidgetGroupWindow::tabLayoutInfo((QDockWidgetGroupWindow *)this_03);
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (int *)0x0;
      local_c8.size = 0;
      this_00 = (QPointer *)(this + 0x7f0);
      bVar4 = QPointer::operator_cast_to_bool(this_00);
      if (bVar4) {
        pQVar8 = QWidget::layout(*(QWidget **)(this + 0x7f8));
        QDockAreaLayoutInfo::indexOf
                  ((QList<int> *)&stack0xffffffffffffff58,
                   (QDockAreaLayoutInfo *)&pQVar8[4].super_QLayoutItem,widget);
        QArrayDataPointer<int>::operator=
                  (&local_c8,(QArrayDataPointer<int> *)&stack0xffffffffffffff58);
        QArrayDataPointer<int>::~QArrayDataPointer
                  ((QArrayDataPointer<int> *)&stack0xffffffffffffff58);
        pQVar8 = QWidget::layout(*(QWidget **)(this + 0x7f8));
        this_04 = QDockAreaLayoutInfo::info
                            ((QDockAreaLayoutInfo *)&pQVar8[4].super_QLayoutItem,
                             (QList<int> *)&local_c8);
      }
      else {
        QDockAreaLayout::indexOf
                  ((QList<int> *)&stack0xffffffffffffff58,(QDockAreaLayout *)(this + 0x1a0),widget);
        QArrayDataPointer<int>::operator=
                  (&local_c8,(QArrayDataPointer<int> *)&stack0xffffffffffffff58);
        QArrayDataPointer<int>::~QArrayDataPointer
                  ((QArrayDataPointer<int> *)&stack0xffffffffffffff58);
        this_04 = QDockAreaLayout::info((QDockAreaLayout *)(this + 0x1a0),(QList<int> *)&local_c8);
      }
      this_05 = &pQVar6[4].super_QLayoutItem;
      lVar14 = (long)local_c8.ptr[local_c8.size + -1];
      bVar4 = this_04->tabbed;
      __last = &this_04->item_list;
      pQVar9 = QList<QDockAreaLayoutItem>::data(__last);
      pQVar2 = pQVar9[lVar14].widgetItem;
      if ((pQVar7 == (QDockAreaLayoutInfo *)0x0) || (bVar4 == false)) {
        pQVar9 = pQVar9 + lVar14;
        if (pQVar2 != (QLayoutItem *)0x0) {
          (*pQVar2->_vptr_QLayoutItem[1])();
        }
        pQVar9->widgetItem = (QLayoutItem *)0x0;
        pQVar7 = (QDockAreaLayoutInfo *)operator_new(0x70);
        QDockAreaLayoutInfo::QDockAreaLayoutInfo(pQVar7,(QDockAreaLayoutInfo *)this_05);
        pQVar9->subinfo = pQVar7;
        QDockAreaLayoutInfo::QDockAreaLayoutInfo((QDockAreaLayoutInfo *)&stack0xffffffffffffff58);
        QDockAreaLayoutInfo::operator=
                  ((QDockAreaLayoutInfo *)this_05,(QDockAreaLayoutInfo *)&stack0xffffffffffffff58);
        QDockAreaLayoutInfo::~QDockAreaLayoutInfo((QDockAreaLayoutInfo *)&stack0xffffffffffffff58);
        pQVar7 = pQVar9->subinfo;
        bVar4 = QPointer::operator_cast_to_bool(this_00);
        if (bVar4) {
          if ((*(long *)this_00 == 0) || (*(int *)(*(long *)this_00 + 4) == 0)) {
            pQVar5 = (QWidget *)0x0;
          }
          else {
            pQVar5 = *(QWidget **)(this + 0x7f8);
          }
        }
        else {
          pQVar5 = QLayout::parentWidget((QLayout *)this);
        }
        QDockAreaLayoutInfo::reparentWidgets(pQVar7,pQVar5);
        QDockAreaLayoutInfo::setTabBarShape(pQVar9->subinfo,this_04->tabBarShape);
      }
      else {
        if (pQVar2 != (QLayoutItem *)0x0) {
          (*pQVar2->_vptr_QLayoutItem[1])();
        }
        QList<QDockAreaLayoutItem>::removeAt(__last,lVar14);
        this_01 = (pQVar7->item_list).d.ptr;
        lVar3 = (pQVar7->item_list).d.size;
        iVar10 = QList<QDockAreaLayoutItem>::begin(__last);
        __result.iter.i = in_R8.i;
        __result.container = (QList<QDockAreaLayoutItem> *)(iVar10.i + lVar14);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<QList<QDockAreaLayoutItem>::const_iterator,std::insert_iterator<QList<QDockAreaLayoutItem>>>
                  ((__copy_move<false,false,std::random_access_iterator_tag> *)this_01,
                   this_01 + lVar3,(const_iterator)__last,__result);
        id = QDockAreaLayoutInfo::currentTabId(pQVar7);
        QDockAreaLayoutInfo::QDockAreaLayoutInfo((QDockAreaLayoutInfo *)&stack0xffffffffffffff58);
        QDockAreaLayoutInfo::operator=
                  ((QDockAreaLayoutInfo *)this_05,(QDockAreaLayoutInfo *)&stack0xffffffffffffff58);
        QDockAreaLayoutInfo::~QDockAreaLayoutInfo((QDockAreaLayoutInfo *)&stack0xffffffffffffff58);
        bVar4 = QPointer::operator_cast_to_bool(this_00);
        if (bVar4) {
          if ((*(long *)this_00 == 0) || (*(int *)(*(long *)this_00 + 4) == 0)) {
            pQVar5 = (QWidget *)0x0;
          }
          else {
            pQVar5 = *(QWidget **)(this + 0x7f8);
          }
        }
        else {
          pQVar5 = QLayout::parentWidget((QLayout *)this);
        }
        QDockAreaLayoutInfo::reparentWidgets(this_04,pQVar5);
        QDockAreaLayoutInfo::updateTabBar(this_04);
        QDockAreaLayoutInfo::setCurrentTabId(this_04,id);
      }
      QDockWidgetGroupWindow::destroyOrHideIfEmpty((QDockWidgetGroupWindow *)this_03);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_c8);
    }
    pQVar5 = &QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&widget->super_QObject)->
              super_QWidget;
    if (pQVar5 != (QWidget *)0x0) {
      bVar4 = QPointer::operator_cast_to_bool((QPointer *)(this + 0x7f0));
      if (bVar4) {
        lVar14 = *(long *)(this + 0x7f0);
        if ((lVar14 == 0) || (*(int *)(lVar14 + 4) == 0)) {
          parent = (QWidget *)0x0;
        }
        else {
          parent = *(QWidget **)(this + 0x7f8);
        }
      }
      else {
        parent = QLayout::parentWidget((QLayout *)this);
      }
      QWidget::setParent(pQVar5,parent);
      QWidget::show(pQVar5);
      QDockWidgetPrivate::plug(*(QDockWidgetPrivate **)&pQVar5->field_0x8,(QRect *)(this + 0x7c8));
    }
    pQVar11 = QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&widget->super_QObject);
    if (pQVar11 != (QToolBar *)0x0) {
      QToolBarPrivate::plug
                (*(QToolBarPrivate **)&(pQVar11->super_QWidget).field_0x8,(QRect *)(this + 0x7c8));
    }
    QMainWindowLayoutState::clear((QMainWindowLayoutState *)(this + 0x3c0));
    QList<int>::clear((QList<int> *)(this + 0x7b0));
    *(undefined8 *)(this + 0x7d8) = 0;
    setCurrentHoveredFloat(this,(QDockWidgetGroupWindow *)0x0);
    QMainWindowLayoutState::apply((QMainWindowLayoutState *)(this + 0x88),false);
    pQVar12 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&widget->super_QObject);
    if (pQVar12 != (QDockWidget *)0x0) {
      pQVar7 = dockInfo(this,widget);
      if (pQVar7 != (QDockAreaLayoutInfo *)0x0) {
        QDockAreaLayoutInfo::setCurrentTab(pQVar7,widget);
      }
    }
  }
  bVar4 = QWidgetAnimator::animating((QWidgetAnimator *)(this + 0x790));
  if (!bVar4) {
    pQVar5 = QLayout::parentWidget((QLayout *)this);
    QDockAreaLayout::separatorRegion((QDockAreaLayout *)&stack0xffffffffffffff58);
    QWidget::update(pQVar5,(QRegion *)&stack0xffffffffffffff58);
    QRegion::~QRegion((QRegion *)&stack0xffffffffffffff58);
    local_c8.d = *(Data **)(this + 0x718);
    if ((local_c8.d != (Data *)0x0) &&
       (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _local_a8 = (piter)QHash<QTabBar_*,_QHashDummyValue>::begin
                                 ((QHash<QTabBar_*,_QHashDummyValue> *)&local_c8);
    while( true ) {
      if (local_a8 == (Data<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_> *)0x0 &&
          local_a8._8_8_ == 0) break;
      pSVar1 = local_a8->spans;
      uVar13 = local_a8._8_8_ >> 7;
      QWidget::show(*(QWidget **)
                     pSVar1[uVar13].entries[pSVar1[uVar13].offsets[local_a8._8_4_ & 0x7f]].storage.
                     data);
      QHashPrivate::iterator<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_>::operator++
                ((iterator<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_> *)
                 &stack0xffffffffffffff58);
    }
    QHash<QTabBar_*,_QHashDummyValue>::~QHash((QHash<QTabBar_*,_QHashDummyValue> *)&local_c8);
  }
  updateGapIndicator(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::animationFinished(QWidget *widget)
{
    //this function is called from within the Widget Animator whenever an animation is finished
    //on a certain widget
#if QT_CONFIG(toolbar)
    if (QToolBar *tb = qobject_cast<QToolBar*>(widget)) {
        QToolBarLayout *tbl = qobject_cast<QToolBarLayout*>(tb->layout());
        if (tbl->animating) {
            tbl->animating = false;
            if (tbl->expanded)
                tbl->layoutActions(tb->size());
            tb->update();
        }
    }
#endif

    if (widget == pluggingWidget) {

#if QT_CONFIG(dockwidget)
#if QT_CONFIG(tabbar)
        if (QDockWidgetGroupWindow *dwgw = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
            // When the animated widget was a QDockWidgetGroupWindow, it means each of the
            // embedded QDockWidget needs to be plugged back into the QMainWindow layout.
            savedState.clear();
            QDockAreaLayoutInfo *srcInfo = dwgw->layoutInfo();
            const QDockAreaLayoutInfo *srcTabInfo = dwgw->tabLayoutInfo();
            QDockAreaLayoutInfo *dstParentInfo;
            QList<int> dstPath;

            if (currentHoveredFloat) {
                dstPath = currentHoveredFloat->layoutInfo()->indexOf(widget);
                Q_ASSERT(dstPath.size() >= 1);
                dstParentInfo = currentHoveredFloat->layoutInfo()->info(dstPath);
            } else {
                dstPath = layoutState.dockAreaLayout.indexOf(widget);
                Q_ASSERT(dstPath.size() >= 2);
                dstParentInfo = layoutState.dockAreaLayout.info(dstPath);
            }
            Q_ASSERT(dstParentInfo);
            int idx = dstPath.constLast();
            Q_ASSERT(dstParentInfo->item_list[idx].widgetItem->widget() == dwgw);
            if (dstParentInfo->tabbed && srcTabInfo) {
                // merge the two tab widgets
                delete dstParentInfo->item_list[idx].widgetItem;
                dstParentInfo->item_list.removeAt(idx);
                std::copy(srcTabInfo->item_list.cbegin(), srcTabInfo->item_list.cend(),
                          std::inserter(dstParentInfo->item_list,
                                        dstParentInfo->item_list.begin() + idx));
                quintptr currentId = srcTabInfo->currentTabId();
                *srcInfo = QDockAreaLayoutInfo();
                dstParentInfo->reparentWidgets(currentHoveredFloat ? currentHoveredFloat.data()
                                                                   : parentWidget());
                dstParentInfo->updateTabBar();
                dstParentInfo->setCurrentTabId(currentId);
            } else {
                QDockAreaLayoutItem &item = dstParentInfo->item_list[idx];
                Q_ASSERT(item.widgetItem->widget() == dwgw);
                delete item.widgetItem;
                item.widgetItem = nullptr;
                item.subinfo = new QDockAreaLayoutInfo(std::move(*srcInfo));
                *srcInfo = QDockAreaLayoutInfo();
                item.subinfo->reparentWidgets(currentHoveredFloat ? currentHoveredFloat.data()
                                                                  : parentWidget());
                item.subinfo->setTabBarShape(dstParentInfo->tabBarShape);
            }
            dwgw->destroyOrHideIfEmpty();
        }
#endif

        if (QDockWidget *dw = qobject_cast<QDockWidget*>(widget)) {
            dw->setParent(currentHoveredFloat ? currentHoveredFloat.data() : parentWidget());
            dw->show();
            dw->d_func()->plug(currentGapRect);
        }
#endif
#if QT_CONFIG(toolbar)
        if (QToolBar *tb = qobject_cast<QToolBar*>(widget))
            tb->d_func()->plug(currentGapRect);
#endif

        savedState.clear();
        currentGapPos.clear();
        pluggingWidget = nullptr;
#if QT_CONFIG(dockwidget)
        setCurrentHoveredFloat(nullptr);
#endif
        //applying the state will make sure that the currentGap is updated correctly
        //and all the geometries (especially the one from the central widget) is correct
        layoutState.apply(false);

#if QT_CONFIG(dockwidget)
#if QT_CONFIG(tabbar)
        if (qobject_cast<QDockWidget*>(widget) != nullptr) {
            // info() might return null if the widget is destroyed while
            // animating but before the animationFinished signal is received.
            if (QDockAreaLayoutInfo *info = dockInfo(widget))
                info->setCurrentTab(widget);
        }
#endif
#endif
    }

    if (!widgetAnimator.animating()) {
        //all animations are finished
#if QT_CONFIG(dockwidget)
        parentWidget()->update(layoutState.dockAreaLayout.separatorRegion());
#if QT_CONFIG(tabbar)
        const auto usedTabBarsCopy = usedTabBars; // list potentially modified by animations
        for (QTabBar *tab_bar : usedTabBarsCopy)
            tab_bar->show();
#endif // QT_CONFIG(tabbar)
#endif // QT_CONFIG(dockwidget)
    }

    updateGapIndicator();
}